

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O0

void __thiscall
higan::TcpConnection::TcpConnection
          (TcpConnection *this,EventLoop *loop,string *connection_name,int fd,InetAddress *address)

{
  TcpConnection *local_130;
  code *local_128;
  undefined8 local_120;
  type local_118;
  ChannelCallback local_100;
  TcpConnection *local_e0;
  code *local_d8;
  undefined8 local_d0;
  type local_c8;
  ChannelCallback local_b0;
  TcpConnection *local_90;
  code *local_88;
  undefined8 local_80;
  type local_78;
  ChannelCallback local_60;
  InetAddress *local_30;
  InetAddress *address_local;
  string *psStack_20;
  int fd_local;
  string *connection_name_local;
  EventLoop *loop_local;
  TcpConnection *this_local;
  
  local_30 = address;
  address_local._4_4_ = fd;
  psStack_20 = connection_name;
  connection_name_local = (string *)loop;
  loop_local = (EventLoop *)this;
  std::enable_shared_from_this<higan::TcpConnection>::enable_shared_from_this
            (&this->super_enable_shared_from_this<higan::TcpConnection>);
  this->loop_ = (EventLoop *)connection_name_local;
  std::__cxx11::string::string((string *)&this->connection_name_,(string *)psStack_20);
  Socket::Socket(&this->socket_,address_local._4_4_,local_30);
  Channel::Channel(&this->channel_,this->loop_,psStack_20,address_local._4_4_);
  Buffer::Buffer(&this->input_buffer_);
  Buffer::Buffer(&this->output_buffer_);
  this->connecting_ = false;
  this->call_send_over_callback_ = false;
  std::function<void_(const_std::shared_ptr<higan::TcpConnection>_&,_higan::Buffer_*)>::function
            (&this->message_callback_);
  std::function<void_(const_std::shared_ptr<higan::TcpConnection>_&)>::function
            (&this->error_callback_);
  std::function<void_(const_std::shared_ptr<higan::TcpConnection>_&)>::function
            (&this->new_connection_callback_);
  std::function<void_(const_std::shared_ptr<higan::TcpConnection>_&)>::function
            (&this->write_over_callback_);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  ::map(&this->context_map_);
  local_88 = OnReadable;
  local_80 = 0;
  local_90 = this;
  std::bind<void(higan::TcpConnection::*)(),higan::TcpConnection*>
            (&local_78,(offset_in_TcpConnection_to_subr *)&local_88,&local_90);
  std::function<void()>::
  function<std::_Bind<void(higan::TcpConnection::*(higan::TcpConnection*))()>,void>
            ((function<void()> *)&local_60,&local_78);
  Channel::SetReadableCallback(&this->channel_,&local_60);
  std::function<void_()>::~function(&local_60);
  local_d8 = OnWritable;
  local_d0 = 0;
  local_e0 = this;
  std::bind<void(higan::TcpConnection::*)(),higan::TcpConnection*>
            (&local_c8,(offset_in_TcpConnection_to_subr *)&local_d8,&local_e0);
  std::function<void()>::
  function<std::_Bind<void(higan::TcpConnection::*(higan::TcpConnection*))()>,void>
            ((function<void()> *)&local_b0,&local_c8);
  Channel::SetWritableCallback(&this->channel_,&local_b0);
  std::function<void_()>::~function(&local_b0);
  local_128 = OnError;
  local_120 = 0;
  local_130 = this;
  std::bind<void(higan::TcpConnection::*)(),higan::TcpConnection*>
            (&local_118,(offset_in_TcpConnection_to_subr *)&local_128,&local_130);
  std::function<void()>::
  function<std::_Bind<void(higan::TcpConnection::*(higan::TcpConnection*))()>,void>
            ((function<void()> *)&local_100,&local_118);
  Channel::SetErrorCallback(&this->channel_,&local_100);
  std::function<void_()>::~function(&local_100);
  return;
}

Assistant:

TcpConnection::TcpConnection(EventLoop* loop, const std::string& connection_name, int fd, const InetAddress& address):
		loop_(loop),
		connection_name_(connection_name),
		socket_(fd, address),
		channel_(loop_, connection_name, fd),
		connecting_(false),
		call_send_over_callback_(false)
{
	channel_.SetReadableCallback(std::bind(&TcpConnection::OnReadable, this));
	channel_.SetWritableCallback(std::bind(&TcpConnection::OnWritable, this));
	channel_.SetErrorCallback(std::bind(&TcpConnection::OnError, this));

}